

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal_simd.c
# Opt level: O0

void FAudio_INTERNAL_Mix_2in_1out_Scalar
               (uint32_t toMix,uint32_t UNUSED1,uint32_t UNUSED2,float *src,float *dst,
               float *coefficients)

{
  uint32_t i;
  float *coefficients_local;
  float *dst_local;
  float *src_local;
  uint32_t UNUSED2_local;
  uint32_t UNUSED1_local;
  uint32_t toMix_local;
  
  dst_local = dst;
  src_local = src;
  for (i = 0; i < toMix; i = i + 1) {
    *dst_local = *src_local * *coefficients + src_local[1] * coefficients[1] + *dst_local;
    src_local = src_local + 2;
    dst_local = dst_local + 1;
  }
  return;
}

Assistant:

void FAudio_INTERNAL_Mix_2in_1out_Scalar(
	uint32_t toMix,
	uint32_t UNUSED1,
	uint32_t UNUSED2,
	float *restrict src,
	float *restrict dst,
	float *restrict coefficients
) {
	uint32_t i;
	for (i = 0; i < toMix; i += 1, src += 2, dst += 1)
	{
		/* Base source data, combined with the coefficients */
		dst[0] += (
			(src[0] * coefficients[0]) +
			(src[1] * coefficients[1])
		);
	}
}